

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::detail::generic_type::mark_parents_nonsimple(generic_type *this,PyTypeObject *value)

{
  bool bVar1;
  PyObject **ppPVar2;
  type_info *ptVar3;
  type_info *tinfo2;
  handle h;
  tuple_iterator __end2;
  sequence_fast_readonly local_38;
  tuple_iterator __begin2;
  tuple *__range2;
  tuple local_20;
  tuple t;
  PyTypeObject *value_local;
  generic_type *this_local;
  
  t.super_object.super_handle.m_ptr = (object)(object)value;
  handle::handle((handle *)&__range2,value->tp_bases);
  reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_20,(handle)__range2);
  __begin2.super_sequence_fast_readonly.ptr =
       (sequence_fast_readonly)(sequence_fast_readonly)&local_20;
  local_38.ptr = (PyObject **)tuple::begin(&local_20);
  h.m_ptr = (PyObject *)tuple::end((tuple *)__begin2.super_sequence_fast_readonly.ptr);
  while( true ) {
    bVar1 = detail::operator!=((It *)&local_38,(It *)&h);
    if (!bVar1) break;
    tinfo2 = (type_info *)
             generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::
             operator*((generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>
                        *)&local_38);
    ppPVar2 = handle::ptr((handle *)&tinfo2);
    ptVar3 = get_type_info((PyTypeObject *)*ppPVar2);
    if (ptVar3 != (type_info *)0x0) {
      ptVar3->field_0x90 = ptVar3->field_0x90 & 0xfe;
    }
    ppPVar2 = handle::ptr((handle *)&tinfo2);
    mark_parents_nonsimple(this,(PyTypeObject *)*ppPVar2);
    generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::operator++
              ((generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly> *)
               &local_38);
  }
  tuple::~tuple(&local_20);
  return;
}

Assistant:

void mark_parents_nonsimple(PyTypeObject *value) {
        auto t = reinterpret_borrow<tuple>(value->tp_bases);
        for (handle h : t) {
            auto tinfo2 = get_type_info((PyTypeObject *) h.ptr());
            if (tinfo2)
                tinfo2->simple_type = false;
            mark_parents_nonsimple((PyTypeObject *) h.ptr());
        }
    }